

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_bitmap.c
# Opt level: O0

GLuint al_get_opengl_texture(ALLEGRO_BITMAP *bitmap)

{
  uint uVar1;
  ALLEGRO_BITMAP *in_RDI;
  ALLEGRO_BITMAP_EXTRA_OPENGL *extra;
  ALLEGRO_BITMAP *local_10;
  GLuint local_4;
  
  local_10 = in_RDI;
  if (in_RDI->parent != (ALLEGRO_BITMAP *)0x0) {
    local_10 = in_RDI->parent;
  }
  uVar1 = al_get_bitmap_flags(local_10);
  if ((uVar1 & 0x20) == 0) {
    local_4 = 0;
  }
  else {
    local_4 = *(GLuint *)((long)local_10->extra + 8);
  }
  return local_4;
}

Assistant:

GLuint al_get_opengl_texture(ALLEGRO_BITMAP *bitmap)
{
   ALLEGRO_BITMAP_EXTRA_OPENGL *extra;
   if (bitmap->parent)
      bitmap = bitmap->parent;
   if (!(al_get_bitmap_flags(bitmap) & _ALLEGRO_INTERNAL_OPENGL))
      return 0;
   extra = bitmap->extra;
   return extra->texture;
}